

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swab.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2199::ByteSwapWrapper::ByteSwapWrapper
          (ByteSwapWrapper *this,string *data_type,int start_address,int start_offset,
          int end_address,int end_offset)

{
  int iVar1;
  ByteSwapInterface *pBVar2;
  undefined **ppuVar3;
  
  this->byte_swap_ = (ByteSwapInterface *)0x0;
  iVar1 = std::__cxx11::string::compare((char *)data_type);
  if (iVar1 == 0) {
    ppuVar3 = &PTR__ByteSwapInterface_00112a28;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)data_type);
    if (iVar1 == 0) {
      ppuVar3 = &PTR__ByteSwapInterface_00112a78;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)data_type);
      if (iVar1 == 0) {
        ppuVar3 = &PTR__ByteSwapInterface_00112ab8;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)data_type);
        if (iVar1 == 0) {
          ppuVar3 = &PTR__ByteSwapInterface_00112af8;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)data_type);
          if (iVar1 == 0) {
            ppuVar3 = &PTR__ByteSwapInterface_00112b38;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)data_type);
            if (iVar1 == 0) {
              ppuVar3 = &PTR__ByteSwapInterface_00112b78;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)data_type);
              if (iVar1 == 0) {
                ppuVar3 = &PTR__ByteSwapInterface_00112bb8;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)data_type);
                if (iVar1 == 0) {
                  ppuVar3 = &PTR__ByteSwapInterface_00112bf8;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)data_type);
                  if (iVar1 == 0) {
                    ppuVar3 = &PTR__ByteSwapInterface_00112c38;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)data_type);
                    if (iVar1 == 0) {
                      ppuVar3 = &PTR__ByteSwapInterface_00112c78;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)data_type);
                      if (iVar1 != 0) {
                        return;
                      }
                      ppuVar3 = &PTR__ByteSwapInterface_00112cb8;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pBVar2 = (ByteSwapInterface *)operator_new(0x18);
  pBVar2->_vptr_ByteSwapInterface = (_func_int **)ppuVar3;
  *(int *)&pBVar2[1]._vptr_ByteSwapInterface = start_address;
  *(int *)((long)&pBVar2[1]._vptr_ByteSwapInterface + 4) = start_offset;
  *(int *)&pBVar2[2]._vptr_ByteSwapInterface = end_address;
  *(int *)((long)&pBVar2[2]._vptr_ByteSwapInterface + 4) = end_offset;
  this->byte_swap_ = pBVar2;
  return;
}

Assistant:

ByteSwapWrapper(const std::string& data_type, int start_address,
                  int start_offset, int end_address, int end_offset)
      : byte_swap_(NULL) {
    if ("s" == data_type) {
      byte_swap_ = new ByteSwap<std::int16_t>(start_address, start_offset,
                                              end_address, end_offset);
    } else if ("h" == data_type) {
      byte_swap_ = new ByteSwap<sptk::int24_t>(start_address, start_offset,
                                               end_address, end_offset);
    } else if ("i" == data_type) {
      byte_swap_ = new ByteSwap<std::int32_t>(start_address, start_offset,
                                              end_address, end_offset);
    } else if ("l" == data_type) {
      byte_swap_ = new ByteSwap<std::int64_t>(start_address, start_offset,
                                              end_address, end_offset);
    } else if ("S" == data_type) {
      byte_swap_ = new ByteSwap<std::uint16_t>(start_address, start_offset,
                                               end_address, end_offset);
    } else if ("H" == data_type) {
      byte_swap_ = new ByteSwap<sptk::uint24_t>(start_address, start_offset,
                                                end_address, end_offset);
    } else if ("I" == data_type) {
      byte_swap_ = new ByteSwap<std::uint32_t>(start_address, start_offset,
                                               end_address, end_offset);
    } else if ("L" == data_type) {
      byte_swap_ = new ByteSwap<std::uint64_t>(start_address, start_offset,
                                               end_address, end_offset);
    } else if ("f" == data_type) {
      byte_swap_ = new ByteSwap<float>(start_address, start_offset, end_address,
                                       end_offset);
    } else if ("d" == data_type) {
      byte_swap_ = new ByteSwap<double>(start_address, start_offset,
                                        end_address, end_offset);
    } else if ("e" == data_type) {
      byte_swap_ = new ByteSwap<long double>(start_address, start_offset,
                                             end_address, end_offset);
    }
  }